

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O3

MPP_RET hal_h265e_vepu580_prepare(void *hal)

{
  long lVar1;
  int buf_idx;
  
  lVar1 = *(long *)((long)hal + 200);
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","enter %p\n","hal_h265e_vepu580_prepare",hal);
  }
  if ((*(byte *)(lVar1 + 8) & 5) != 0) {
    vepu580_h265_setup_hal_bufs((H265eV580HalContext *)hal);
    if (0 < *(int *)((long)hal + 0x108)) {
      buf_idx = 0;
      do {
        hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x130),buf_idx);
        buf_idx = buf_idx + 1;
      } while (buf_idx < *(int *)((long)hal + 0x108));
    }
    *(undefined4 *)(lVar1 + 8) = 0;
  }
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave %p\n","hal_h265e_vepu580_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265e_vepu580_prepare(void *hal)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    MppEncPrepCfg *prep = &ctx->cfg->prep;

    hal_h265e_dbg_func("enter %p\n", hal);

    if (prep->change & (MPP_ENC_PREP_CFG_CHANGE_INPUT | MPP_ENC_PREP_CFG_CHANGE_FORMAT)) {
        RK_S32 i;

        // pre-alloc required buffers to reduce first frame delay
        vepu580_h265_setup_hal_bufs(ctx);
        for (i = 0; i < ctx->max_buf_cnt; i++)
            hal_bufs_get_buf(ctx->dpb_bufs, i);

        prep->change = 0;
    }

    hal_h265e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}